

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

void matd_ltriangle_solve(matd_t *L,double *b,double *x)

{
  uint uVar1;
  int local_34;
  double dStack_30;
  int j;
  double acc;
  int i;
  int n;
  double *x_local;
  double *b_local;
  matd_t *L_local;
  
  uVar1 = L->ncols;
  for (acc._0_4_ = 0; acc._0_4_ < (int)uVar1; acc._0_4_ = acc._0_4_ + 1) {
    dStack_30 = b[acc._0_4_];
    for (local_34 = 0; local_34 < acc._0_4_; local_34 = local_34 + 1) {
      dStack_30 = -(double)L[(ulong)(acc._0_4_ * L->ncols + local_34) + 1] * x[local_34] + dStack_30
      ;
    }
    x[acc._0_4_] = dStack_30 / (double)L[(ulong)(acc._0_4_ * L->ncols + acc._0_4_) + 1];
  }
  return;
}

Assistant:

void matd_ltriangle_solve(matd_t *L, const TYPE *b, TYPE *x)
{
    int n = L->ncols;

    for (int i = 0; i < n; i++) {
        double acc = b[i];

        for (int j = 0; j < i; j++) {
            acc -= MATD_EL(L, i, j)*x[j];
        }

        x[i] = acc / MATD_EL(L, i, i);
    }
}